

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::populateBoard(Board *this,ifstream *dataFile)

{
  Block block;
  istream *piVar1;
  int id;
  char direction;
  int length;
  int column;
  int row;
  Block tempBlock;
  Block local_44;
  
  Block::Block(&tempBlock);
  id = 1;
  while( true ) {
    piVar1 = (istream *)std::istream::operator>>((istream *)dataFile,&row);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&column);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&length);
    piVar1 = std::operator>>(piVar1,&direction);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    Block::Block(&local_44,id,row + -1,column + -1,length,direction);
    tempBlock.direction = local_44.direction;
    tempBlock.id = local_44.id;
    tempBlock.row = local_44.row;
    tempBlock.column = local_44.column;
    tempBlock.length = local_44.length;
    std::vector<Block,_std::allocator<Block>_>::push_back(&this->blocks,&tempBlock);
    block.column = tempBlock.column;
    block.length = tempBlock.length;
    block.id = tempBlock.id;
    block.row = tempBlock.row;
    block.direction = tempBlock.direction;
    insert(this,block,-1);
    id = id + 1;
  }
  return;
}

Assistant:

void Board::populateBoard(std::ifstream &dataFile) {
    int row, column, length;
    int id = 1;
    char direction;
    Block tempBlock;

    // Collect the other blocks.
    while (dataFile >> row >> column >> length >> direction) {
        // Construct a temporary block.
        tempBlock = Block(id++, row - 1, column - 1, length, direction);

        // Fill the cells storage variables.
        this->blocks.push_back(tempBlock);
        this->insert(tempBlock);
    }
}